

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

int wstran_listener_bind(void *arg,nng_url *url)

{
  int iVar1;
  undefined8 in_RAX;
  uint32_t local_24 [2];
  int port;
  
  local_24[0] = (uint32_t)((ulong)in_RAX >> 0x20);
  iVar1 = nng_stream_listener_listen(*(nng_stream_listener **)((long)arg + 0x210));
  if (iVar1 == 0) {
    nng_stream_listener_get_int
              (*(nng_stream_listener **)((long)arg + 0x210),"tcp-bound-port",(int *)local_24);
    url->u_port = local_24[0];
  }
  return iVar1;
}

Assistant:

static int
wstran_listener_bind(void *arg, nng_url *url)
{
	ws_listener *l = arg;
	int          rv;

	if ((rv = nng_stream_listener_listen(l->listener)) == 0) {
		int port;
		nng_stream_listener_get_int(
		    l->listener, NNG_OPT_TCP_BOUND_PORT, &port);
		url->u_port = (uint32_t) port;
	}
	return (rv);
}